

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountTest.cpp
# Opt level: O0

string * __thiscall
oout::FmtTests::suite
          (string *__return_storage_ptr__,FmtTests *this,string *param_1,nanoseconds *param_2,
          list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
          *results)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _List_const_iterator<std::shared_ptr<const_oout::Result>_> local_40;
  _List_const_iterator<std::shared_ptr<const_oout::Result>_> local_38;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  *local_30;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  *results_local;
  nanoseconds *param_2_local;
  string *param_1_local;
  FmtTests *this_local;
  
  local_30 = results;
  results_local =
       (list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
        *)param_2;
  param_2_local = (nanoseconds *)param_1;
  param_1_local = (string *)this;
  this_local = (FmtTests *)__return_storage_ptr__;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
       ::begin(results);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
       ::end(local_30);
  std::__cxx11::string::string((string *)&local_60);
  std::
  accumulate<std::_List_const_iterator<std::shared_ptr<oout::Result_const>>,std::__cxx11::string,oout::FmtTests::suite(std::__cxx11::string_const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>const&,std::__cxx11::list<std::shared_ptr<oout::Result_const>,std::allocator<std::shared_ptr<oout::Result_const>>>const&)const::_lambda(std::__cxx11::string_const&,auto:1_const&)_1_>
            (__return_storage_ptr__,local_38,local_40,&local_60,(anon_class_8_1_8991fb9c)this);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

string suite(
		const string &,
		const chrono::nanoseconds &,
		const list<shared_ptr<const Result>> &results
	) const override
	{
		return accumulate(
			results.begin(),
			results.end(),
			string{},
			[this](const string &v, const auto &r){
				return v + r->print(*this);
			}
		);
	}